

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void ImportModuleNamespaces(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  SmallArray<NamespaceData_*,_128U> *this;
  ByteCode *code;
  Allocator *allocator;
  ScopeData *scope;
  SmallArray<NamespaceData_*,_2U> *pSVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ExternNamespaceInfo *pEVar5;
  size_t sVar6;
  undefined4 extraout_var;
  NamespaceData **ppNVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  NamespaceData *parent;
  ulong uVar12;
  TraceScope traceScope;
  TraceScope local_90;
  SynIdentifier local_80;
  NamespaceData *pNVar7;
  
  if ((ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)
                                   ::token), iVar3 != 0)) {
    ImportModuleNamespaces::token = NULLC::TraceGetToken("analyze","ImportModuleNamespaces");
    __cxa_guard_release(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_90,ImportModuleNamespaces::token);
  code = moduleCtx->data->bytecode;
  pcVar4 = FindSymbols(code);
  pEVar5 = FindFirstNamespace(code);
  if (code->namespaceCount != 0) {
    this = &ctx->namespaces;
    uVar12 = 0;
    do {
      pcVar10 = pcVar4 + pEVar5[uVar12].offsetToName;
      sVar6 = strlen(pcVar10);
      uVar2 = NULLC::GetStringHash(pcVar10,pcVar10 + sVar6);
      uVar9 = (ulong)(ctx->namespaces).count;
      if (uVar9 == 0) {
        if (pEVar5[uVar12].parentHash != 0xffffffff) {
LAB_0016f0bd:
          anon_unknown.dwarf_9c70f::Stop
                    (ctx,source,"ERROR: namespace %s parent not found",
                     pcVar4 + pEVar5[uVar12].offsetToName);
        }
        parent = (NamespaceData *)0x0;
LAB_0016ef2a:
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
        pNVar7 = (NamespaceData *)CONCAT44(extraout_var,iVar3);
        allocator = ctx->allocator;
        scope = ctx->scope;
        pcVar10 = pcVar4 + pEVar5[uVar12].offsetToName;
        sVar6 = strlen(pcVar10);
        local_80.name.end = pcVar10 + sVar6;
        local_80.super_SynBase.typeID = 4;
        local_80.super_SynBase.begin = (Lexeme *)0x0;
        local_80.super_SynBase.end = (Lexeme *)0x0;
        local_80.super_SynBase.pos.begin = (char *)0x0;
        local_80.super_SynBase.pos.end._0_2_ = 0;
        local_80.super_SynBase.pos.end._2_6_ = 0;
        local_80.super_SynBase.next._0_2_ = 0;
        local_80.super_SynBase._50_8_ = 0;
        local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
        uVar2 = ctx->uniqueNamespaceId;
        ctx->uniqueNamespaceId = uVar2 + 1;
        local_80.name.begin = pcVar10;
        NamespaceData::NamespaceData(pNVar7,allocator,source,scope,parent,&local_80,uVar2);
        if (parent == (NamespaceData *)0x0) {
          uVar2 = (ctx->globalNamespaces).count;
          if (uVar2 == (ctx->globalNamespaces).max) {
            SmallArray<NamespaceData_*,_2U>::grow(&ctx->globalNamespaces,uVar2);
          }
          ppNVar8 = (ctx->globalNamespaces).data;
          pSVar1 = &ctx->globalNamespaces;
          if (ppNVar8 == (NamespaceData **)0x0) goto LAB_0016f0e4;
        }
        else {
          uVar2 = (parent->children).count;
          if (uVar2 == (parent->children).max) {
            SmallArray<NamespaceData_*,_2U>::grow(&parent->children,uVar2);
          }
          ppNVar8 = (parent->children).data;
          if (ppNVar8 == (NamespaceData **)0x0) {
LAB_0016f0e4:
            pcVar4 = 
            "void SmallArray<NamespaceData *, 2>::push_back(const T &) [T = NamespaceData *, N = 2]"
            ;
            goto LAB_0016f110;
          }
          pSVar1 = &parent->children;
        }
        uVar2 = pSVar1->count;
        pSVar1->count = uVar2 + 1;
        ppNVar8[uVar2] = pNVar7;
        uVar2 = (ctx->namespaces).count;
        if (uVar2 == (ctx->namespaces).max) {
          SmallArray<NamespaceData_*,_128U>::grow(this,uVar2);
        }
        if (this->data == (NamespaceData **)0x0) {
          pcVar4 = 
          "void SmallArray<NamespaceData *, 128>::push_back(const T &) [T = NamespaceData *, N = 128]"
          ;
LAB_0016f110:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,pcVar4);
        }
        uVar2 = (ctx->namespaces).count;
        (ctx->namespaces).count = uVar2 + 1;
        this->data[uVar2] = pNVar7;
      }
      else {
        uVar11 = 0;
        do {
          pNVar7 = this->data[uVar11];
          if (pNVar7->nameHash == uVar2) goto LAB_0016eec5;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
        pNVar7 = (NamespaceData *)0x0;
LAB_0016eec5:
        if (pEVar5[uVar12].parentHash == 0xffffffff) {
          parent = (NamespaceData *)0x0;
        }
        else {
          if (uVar9 == 0) goto LAB_0016f0bd;
          uVar11 = 0;
          while (parent = this->data[uVar11], parent->nameHash != pEVar5[uVar12].parentHash) {
            uVar11 = uVar11 + 1;
            if (uVar9 == uVar11) goto LAB_0016f0bd;
          }
        }
        if ((pNVar7 == (NamespaceData *)0x0) || (pNVar7->parent != parent)) goto LAB_0016ef2a;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < code->namespaceCount);
  }
  NULLC::TraceScope::~TraceScope(&local_90);
  return;
}

Assistant:

void ImportModuleNamespaces(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleNamespaces");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &namespaceData = namespaceList[i];

		unsigned nameHash = InplaceStr(symbols + namespaceData.offsetToName).hash();

		NamespaceData *prev = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->nameHash == nameHash)
			{
				prev = ctx.namespaces[k];
				break;
			}
		}

		NamespaceData *parent = NULL;

		if(namespaceData.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaces.size(); k++)
			{
				if(ctx.namespaces[k]->nameHash == namespaceData.parentHash)
				{
					parent = ctx.namespaces[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, source, "ERROR: namespace %s parent not found", symbols + namespaceData.offsetToName);
		}

		if(prev && prev->parent == parent)
			continue;

		NamespaceData *ns = new (ctx.get<NamespaceData>()) NamespaceData(ctx.allocator, source, ctx.scope, parent, SynIdentifier(InplaceStr(symbols + namespaceData.offsetToName)), ctx.uniqueNamespaceId++);

		if(parent)
			parent->children.push_back(ns);
		else
			ctx.globalNamespaces.push_back(ns);

		ctx.namespaces.push_back(ns);
	}
}